

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgVariableValue.cpp
# Opt level: O3

void __thiscall rsg::VariableValue::VariableValue(VariableValue *this,VariableValue *other)

{
  Variable *type;
  pointer __src;
  pointer __dest;
  int iVar1;
  
  type = other->m_variable;
  this->m_variable = type;
  ValueStorage<1>::ValueStorage(&this->m_storage,&type->m_type);
  __src = (other->m_storage).m_value.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>.
          _M_impl.super__Vector_impl_data._M_start;
  __dest = (this->m_storage).m_value.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>.
           _M_impl.super__Vector_impl_data._M_start;
  iVar1 = VariableType::getScalarSize(&this->m_variable->m_type);
  if (iVar1 != 0) {
    memmove(__dest,__src,(long)iVar1 << 2);
    return;
  }
  return;
}

Assistant:

VariableValue::VariableValue (const VariableValue& other)
	: m_variable(other.m_variable)
	, m_storage(other.m_variable->getType())
{
	m_storage.getValue(getType()) = other.getValue().value();
}